

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

void buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(Model *m)

{
  NeuralNetwork *nn;
  Type *this;
  SoftmaxLayerParams *this_00;
  string local_40;
  
  nn = buildBasicUpdatableNeuralNetworkModel(m);
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (&(nn->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"softmax","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_40)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"softmax_out");
  if (this->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0xaf;
    this_00 = (SoftmaxLayerParams *)operator_new(0x18);
    CoreML::Specification::SoftmaxLayerParams::SoftmaxLayerParams(this_00);
    (this->layer_).softmax_ = this_00;
  }
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (m,nn,"cross_entropy_loss_layer","softmax_out","label_target");
  return;
}

Assistant:

void buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(Specification::Model& m) {

    auto *nn = buildBasicUpdatableNeuralNetworkModel(m);

    // set a softmax layer
    auto softmaxLayer = nn->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("B");
    softmaxLayer->add_output("softmax_out");
    softmaxLayer->mutable_softmax();

    addCategoricalCrossEntropyLoss(m, nn, "cross_entropy_loss_layer", "softmax_out", "label_target");
}